

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

char * kj::skipSpace(char *p)

{
  for (; (*p == ' ' || (*p == '\t')); p = p + 1) {
  }
  return p;
}

Assistant:

static inline const char* skipSpace(const char* p) {
  for (;;) {
    switch (*p) {
      case '\t':
      case ' ':
        ++p;
        break;
      default:
        return p;
    }
  }
}